

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall fasttext::SoftmaxLoss::computeOutput(SoftmaxLoss *this,State *state)

{
  pointer pfVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  byte bVar17;
  byte bVar18;
  pointer pfVar19;
  ulong uVar20;
  uint uVar21;
  ushort uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  double dVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  float local_38;
  
  Vector::mul(&state->output,
              (((this->super_Loss).wo_)->
              super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
              &state->hidden);
  pfVar19 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar21 = (uint)((ulong)((long)(state->output).data_.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pfVar19) >> 2);
  if (0 < (int)uVar21) {
    auVar28 = ZEXT464((uint)*pfVar19);
    uVar20 = 0;
    do {
      auVar15 = vmaxss_avx(auVar28._0_16_,ZEXT416((uint)pfVar19[uVar20]));
      auVar28 = ZEXT1664(auVar15);
      uVar20 = uVar20 + 1;
    } while ((uVar21 & 0x7fffffff) != uVar20);
    if (0 < (int)uVar21) {
      auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar20 = 0;
      do {
        dVar27 = exp((double)(pfVar19[uVar20] - auVar28._0_4_));
        local_38 = auVar29._0_4_;
        auVar28 = ZEXT464((uint)auVar28._0_4_);
        pfVar19 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar19[uVar20] = (float)dVar27;
        uVar20 = uVar20 + 1;
        local_38 = local_38 + (float)dVar27;
        auVar29 = ZEXT464((uint)local_38);
      } while ((uVar21 & 0x7fffffff) != uVar20);
      if (0 < (int)uVar21) {
        auVar28 = vbroadcastss_avx512f(ZEXT416((uint)local_38));
        auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar20 = 0;
        auVar24 = vpbroadcastq_avx512f();
        do {
          auVar25 = vpbroadcastq_avx512f();
          auVar26 = vporq_avx512f(auVar25,auVar29);
          auVar25 = vporq_avx512f(auVar25,auVar23);
          uVar16 = vpcmpuq_avx512f(auVar25,auVar24,2);
          bVar17 = (byte)uVar16;
          uVar16 = vpcmpuq_avx512f(auVar26,auVar24,2);
          bVar18 = (byte)uVar16;
          uVar22 = CONCAT11(bVar18,bVar17);
          pfVar1 = pfVar19 + uVar20;
          auVar25._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * (int)pfVar1[1];
          auVar25._0_4_ = (uint)(bVar17 & 1) * (int)*pfVar1;
          auVar25._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * (int)pfVar1[2];
          auVar25._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * (int)pfVar1[3];
          auVar25._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * (int)pfVar1[4];
          auVar25._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * (int)pfVar1[5];
          auVar25._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * (int)pfVar1[6];
          auVar25._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * (int)pfVar1[7];
          auVar25._32_4_ = (uint)(bVar18 & 1) * (int)pfVar1[8];
          auVar25._36_4_ = (uint)(bVar18 >> 1 & 1) * (int)pfVar1[9];
          auVar25._40_4_ = (uint)(bVar18 >> 2 & 1) * (int)pfVar1[10];
          auVar25._44_4_ = (uint)(bVar18 >> 3 & 1) * (int)pfVar1[0xb];
          auVar25._48_4_ = (uint)(bVar18 >> 4 & 1) * (int)pfVar1[0xc];
          auVar25._52_4_ = (uint)(bVar18 >> 5 & 1) * (int)pfVar1[0xd];
          auVar25._56_4_ = (uint)(bVar18 >> 6 & 1) * (int)pfVar1[0xe];
          auVar25._60_4_ = (uint)(bVar18 >> 7) * (int)pfVar1[0xf];
          auVar25 = vdivps_avx512f(auVar25,auVar28);
          pfVar1 = pfVar19 + uVar20;
          bVar2 = (bool)((byte)(uVar22 >> 1) & 1);
          bVar3 = (bool)((byte)(uVar22 >> 2) & 1);
          bVar4 = (bool)((byte)(uVar22 >> 3) & 1);
          bVar5 = (bool)((byte)(uVar22 >> 4) & 1);
          bVar6 = (bool)((byte)(uVar22 >> 5) & 1);
          bVar7 = (bool)((byte)(uVar22 >> 6) & 1);
          bVar8 = (bool)((byte)(uVar22 >> 7) & 1);
          bVar9 = (bool)(bVar18 >> 1 & 1);
          bVar10 = (bool)(bVar18 >> 2 & 1);
          bVar11 = (bool)(bVar18 >> 3 & 1);
          bVar12 = (bool)(bVar18 >> 4 & 1);
          bVar13 = (bool)(bVar18 >> 5 & 1);
          bVar14 = (bool)(bVar18 >> 6 & 1);
          *pfVar1 = (float)((uint)(bVar17 & 1) * auVar25._0_4_ |
                           (uint)!(bool)(bVar17 & 1) * (int)*pfVar1);
          pfVar1[1] = (float)((uint)bVar2 * auVar25._4_4_ | (uint)!bVar2 * (int)pfVar1[1]);
          pfVar1[2] = (float)((uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * (int)pfVar1[2]);
          pfVar1[3] = (float)((uint)bVar4 * auVar25._12_4_ | (uint)!bVar4 * (int)pfVar1[3]);
          pfVar1[4] = (float)((uint)bVar5 * auVar25._16_4_ | (uint)!bVar5 * (int)pfVar1[4]);
          pfVar1[5] = (float)((uint)bVar6 * auVar25._20_4_ | (uint)!bVar6 * (int)pfVar1[5]);
          pfVar1[6] = (float)((uint)bVar7 * auVar25._24_4_ | (uint)!bVar7 * (int)pfVar1[6]);
          pfVar1[7] = (float)((uint)bVar8 * auVar25._28_4_ | (uint)!bVar8 * (int)pfVar1[7]);
          pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar25._32_4_ |
                             (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
          pfVar1[9] = (float)((uint)bVar9 * auVar25._36_4_ | (uint)!bVar9 * (int)pfVar1[9]);
          pfVar1[10] = (float)((uint)bVar10 * auVar25._40_4_ | (uint)!bVar10 * (int)pfVar1[10]);
          pfVar1[0xb] = (float)((uint)bVar11 * auVar25._44_4_ | (uint)!bVar11 * (int)pfVar1[0xb]);
          pfVar1[0xc] = (float)((uint)bVar12 * auVar25._48_4_ | (uint)!bVar12 * (int)pfVar1[0xc]);
          pfVar1[0xd] = (float)((uint)bVar13 * auVar25._52_4_ | (uint)!bVar13 * (int)pfVar1[0xd]);
          pfVar1[0xe] = (float)((uint)bVar14 * auVar25._56_4_ | (uint)!bVar14 * (int)pfVar1[0xe]);
          pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar25._60_4_ |
                               (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
          uVar20 = uVar20 + 0x10;
        } while ((uVar21 + 0xf & 0xfffffff0) != uVar20);
      }
    }
  }
  return;
}

Assistant:

void SoftmaxLoss::computeOutput(Model::State& state) const {
  Vector& output = state.output;
  output.mul(*wo_, state.hidden);
  real max = output[0], z = 0.0;
  int32_t osz = output.size();
  for (int32_t i = 0; i < osz; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] /= z;
  }
}